

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O1

amqp_rpc_reply_t *
amqp_basic_get(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
              amqp_channel_t channel,amqp_bytes_t queue,amqp_boolean_t no_ack)

{
  int iVar1;
  undefined4 uVar2;
  amqp_response_type_enum aVar3;
  undefined4 uVar4;
  amqp_method_number_t aVar5;
  undefined4 uVar6;
  amqp_method_number_t replies [3];
  amqp_method_number_t local_68 [4];
  amqp_rpc_reply_t local_58;
  undefined2 local_38 [4];
  size_t local_30;
  void *local_28;
  amqp_boolean_t local_20;
  
  local_28 = queue.bytes;
  local_30 = queue.len;
  local_68[0] = 0x3c0047;
  local_68[1] = 0x3c0048;
  local_68[2] = 0;
  local_38[0] = 0;
  local_20 = no_ack;
  amqp_simple_rpc(&local_58,state,channel,0x3c0046,local_68,local_38);
  (state->most_recent_api_result).reply.decoded = local_58.reply.decoded;
  (state->most_recent_api_result).library_error = local_58.library_error;
  *(undefined4 *)&(state->most_recent_api_result).field_0x1c = local_58._28_4_;
  (state->most_recent_api_result).reply_type = local_58.reply_type;
  *(undefined4 *)&(state->most_recent_api_result).field_0x4 = local_58._4_4_;
  (state->most_recent_api_result).reply.id = local_58.reply.id;
  *(undefined4 *)&(state->most_recent_api_result).reply.field_0x4 = local_58.reply._4_4_;
  aVar3 = (state->most_recent_api_result).reply_type;
  uVar4 = *(undefined4 *)&(state->most_recent_api_result).field_0x4;
  aVar5 = (state->most_recent_api_result).reply.id;
  uVar6 = *(undefined4 *)&(state->most_recent_api_result).reply.field_0x4;
  iVar1 = (state->most_recent_api_result).library_error;
  uVar2 = *(undefined4 *)&(state->most_recent_api_result).field_0x1c;
  (__return_storage_ptr__->reply).decoded = (state->most_recent_api_result).reply.decoded;
  __return_storage_ptr__->library_error = iVar1;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar2;
  __return_storage_ptr__->reply_type = aVar3;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar4;
  (__return_storage_ptr__->reply).id = aVar5;
  *(undefined4 *)&(__return_storage_ptr__->reply).field_0x4 = uVar6;
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t amqp_basic_get(amqp_connection_state_t state,
                                amqp_channel_t channel, amqp_bytes_t queue,
                                amqp_boolean_t no_ack) {
  amqp_method_number_t replies[] = {AMQP_BASIC_GET_OK_METHOD,
                                    AMQP_BASIC_GET_EMPTY_METHOD, 0};
  amqp_basic_get_t req;
  req.ticket = 0;
  req.queue = queue;
  req.no_ack = no_ack;

  state->most_recent_api_result =
      amqp_simple_rpc(state, channel, AMQP_BASIC_GET_METHOD, replies, &req);
  return state->most_recent_api_result;
}